

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.hpp
# Opt level: O1

enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_> *
__thiscall
toml::detail::string_conv<std::__cxx11::string,char,std::char_traits<char>,std::allocator<char>>
          (enable_if_t<is_std_basic_string<basic_string<char>_>::value,_std::__cxx11::basic_string<char>_>
           *__return_storage_ptr__,detail *this,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  detail *pdVar1;
  size_type sVar2;
  detail *local_20;
  size_type local_10;
  undefined8 uStack_8;
  
  pdVar1 = this + 0x10;
  if (*(detail **)this == pdVar1) {
    local_10 = *(size_type *)pdVar1;
    uStack_8 = *(undefined8 *)(this + 0x18);
    local_20 = (detail *)&local_10;
  }
  else {
    local_10 = *(size_type *)pdVar1;
    local_20 = *(detail **)this;
  }
  sVar2 = *(size_type *)(this + 8);
  *(detail **)this = pdVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (detail)0x0;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_20 == (detail *)&local_10) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_10;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_8;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_20;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_10;
  }
  __return_storage_ptr__->_M_string_length = sVar2;
  return __return_storage_ptr__;
}

Assistant:

cxx::enable_if_t<is_std_basic_string<S>::value, S>
string_conv(std::basic_string<Char2, Traits2, Alloc2> s)
{
    using C = typename S::value_type;
    using T = typename S::traits_type;
    using A = typename S::allocator_type;
    return string_conv_impl<C, T, A, Char2, Traits2, Alloc2>::invoke(std::move(s));
}